

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_value_numbering.cpp
# Opt level: O0

string * __thiscall
mocker::LocalValueNumbering::hash_abi_cxx11_
          (string *__return_storage_ptr__,LocalValueNumbering *this,
          shared_ptr<mocker::ir::Addr> *addr)

{
  bool bVar1;
  element_type *this_00;
  int64_t __val;
  element_type *peVar2;
  string *psVar3;
  undefined1 local_80 [8];
  shared_ptr<mocker::ir::Reg> p_2;
  shared_ptr<mocker::ir::Reg> p_1;
  string local_50;
  undefined1 local_30 [8];
  shared_ptr<mocker::ir::IntLiteral> p;
  shared_ptr<mocker::ir::Addr> *addr_local;
  LocalValueNumbering *this_local;
  
  p.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)addr;
  ir::dyc<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>((ir *)local_30,addr);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_30);
    __val = ir::IntLiteral::getVal(this_00);
    std::__cxx11::to_string(&local_50,__val);
    std::operator+(__return_storage_ptr__,"int:",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr
            ((shared_ptr<mocker::ir::IntLiteral> *)local_30);
  if (!bVar1) {
    ir::dycGlobalReg((ir *)&p_2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                     (shared_ptr<mocker::ir::Addr> *)
                     p.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &p_2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&p_2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      psVar3 = ir::Reg::getIdentifier_abi_cxx11_(peVar2);
      std::operator+(__return_storage_ptr__,"global:",psVar3);
    }
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr
              ((shared_ptr<mocker::ir::Reg> *)
               &p_2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (!bVar1) {
      ir::dycLocalReg((ir *)local_80,
                      (shared_ptr<mocker::ir::Addr> *)
                      p.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_80);
      if (bVar1) {
        peVar2 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_80);
        psVar3 = ir::Reg::getIdentifier_abi_cxx11_(peVar2);
        std::operator+(__return_storage_ptr__,"local:",psVar3);
      }
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_80);
      if (!bVar1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                      ,0x41,
                      "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::Addr> &)"
                     );
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LocalValueNumbering::hash(const std::shared_ptr<ir::Addr> &addr) {
  if (auto p = ir::dyc<ir::IntLiteral>(addr))
    return "int:" + std::to_string(p->getVal());
  if (auto p = ir::dycGlobalReg(addr))
    return "global:" + p->getIdentifier();
  if (auto p = ir::dycLocalReg(addr))
    return "local:" + p->getIdentifier();
  assert(false);
}